

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O1

int __thiscall
ncnn::UnaryOp_x86::forward_inplace(UnaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  __m128 *pafVar9;
  undefined1 (*pauVar10) [16];
  long lVar11;
  uint uVar12;
  undefined4 extraout_XMM0_Db;
  uint uVar26;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar17 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 extraout_XMM0_Db_01;
  undefined1 auVar21 [16];
  uint uVar13;
  uint uVar24;
  uint uVar25;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar30;
  float fVar37;
  float fVar38;
  undefined1 auVar31 [16];
  float fVar39;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar40;
  float fVar44;
  float fVar45;
  undefined1 in_XMM2 [16];
  float fVar46;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar51;
  float fVar52;
  undefined1 in_XMM3 [16];
  undefined1 auVar47 [16];
  float fVar53;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM5 [16];
  __m128 afVar54;
  unary_op_tan op;
  uint local_98;
  unary_op_tan local_79;
  undefined8 local_78;
  float local_68;
  float local_58;
  __m128 local_48;
  
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86[-3])) {
  case 0:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar31._0_8_ = *(ulong *)*pauVar10 & 0x7fffffff7fffffff;
            auVar31._8_4_ = *(uint *)((long)*pauVar10 + 8) & 0x7fffffff;
            auVar31._12_4_ = *(uint *)((long)*pauVar10 + 0xc) & 0x7fffffff;
            *pauVar10 = auVar31;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = uVar6 & 0xfffffffc;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            *(uint *)((long)*pauVar10 + lVar11 * 4) =
                 *(uint *)((long)*pauVar10 + lVar11 * 4) & 0x7fffffff;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 1:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar34._0_8_ = *(ulong *)*pauVar10 ^ 0x8000000080000000;
            auVar34._8_4_ = *(uint *)((long)*pauVar10 + 8) ^ 0x80000000;
            auVar34._12_4_ = *(uint *)((long)*pauVar10 + 0xc) ^ 0x80000000;
            *pauVar10 = auVar34;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = uVar6 & 0xfffffffc;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            *(uint *)((long)*pauVar10 + lVar11 * 4) =
                 *(uint *)((long)*pauVar10 + lVar11 * 4) ^ 0x80000000;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 2:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_98 = uVar6 & 0xfffffffc;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar23 = *pauVar10;
            fVar30 = auVar23._0_4_;
            fVar40 = auVar23._4_4_;
            fVar37 = auVar23._8_4_;
            fVar44 = auVar23._12_4_;
            uVar12 = -(uint)(ABS(fVar30) <= 8388608.0);
            uVar13 = -(uint)(ABS(fVar40) <= 8388608.0);
            uVar24 = -(uint)(ABS(fVar37) <= 8388608.0);
            uVar25 = -(uint)(ABS(fVar44) <= 8388608.0);
            fVar38 = (float)((uint)(float)(int)ABS(fVar30) | (uint)fVar30 & 0x80000000);
            fVar45 = (float)((uint)(float)(int)ABS(fVar40) | (uint)fVar40 & 0x80000000);
            fVar39 = (float)((uint)(float)(int)ABS(fVar37) | (uint)fVar37 & 0x80000000);
            fVar46 = (float)((uint)(float)(int)ABS(fVar44) | (uint)fVar44 & 0x80000000);
            auVar49._0_4_ = (uint)(fVar38 - (float)(-(uint)(fVar30 < fVar38) & 0x3f800000)) & uVar12
            ;
            auVar49._4_4_ = (uint)(fVar45 - (float)(-(uint)(fVar40 < fVar45) & 0x3f800000)) & uVar13
            ;
            auVar49._8_4_ = (uint)(fVar39 - (float)(-(uint)(fVar37 < fVar39) & 0x3f800000)) & uVar24
            ;
            auVar49._12_4_ =
                 (uint)(fVar46 - (float)(-(uint)(fVar44 < fVar46) & 0x3f800000)) & uVar25;
            auVar32._0_4_ = ~uVar12 & (uint)fVar30;
            auVar32._4_4_ = ~uVar13 & (uint)fVar40;
            auVar32._8_4_ = ~uVar24 & (uint)fVar37;
            auVar32._12_4_ = ~uVar25 & (uint)fVar44;
            *pauVar10 = auVar32 | auVar49;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = local_98;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = floorf(*(float *)(*pauVar10 + lVar11 * 4));
            *(float *)(*pauVar10 + lVar11 * 4) = fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 3:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_98 = uVar6 & 0xfffffffc;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar23 = *pauVar10;
            fVar30 = auVar23._0_4_;
            fVar40 = auVar23._4_4_;
            fVar37 = auVar23._8_4_;
            fVar44 = auVar23._12_4_;
            uVar12 = -(uint)(ABS(fVar30) <= 8388608.0);
            uVar13 = -(uint)(ABS(fVar40) <= 8388608.0);
            uVar24 = -(uint)(ABS(fVar37) <= 8388608.0);
            uVar25 = -(uint)(ABS(fVar44) <= 8388608.0);
            fVar38 = (float)((uint)(float)(int)ABS(fVar30) | (uint)fVar30 & 0x80000000);
            fVar45 = (float)((uint)(float)(int)ABS(fVar40) | (uint)fVar40 & 0x80000000);
            fVar39 = (float)((uint)(float)(int)ABS(fVar37) | (uint)fVar37 & 0x80000000);
            fVar46 = (float)((uint)(float)(int)ABS(fVar44) | (uint)fVar44 & 0x80000000);
            auVar50._0_4_ =
                 (uint)(fVar38 - (float)(-(uint)(fVar38 < fVar30 && 0.0 < fVar30) & 0xbf800000)) &
                 uVar12;
            auVar50._4_4_ =
                 (uint)(fVar45 - (float)(-(uint)(fVar45 < fVar40 && 0.0 < fVar40) & 0xbf800000)) &
                 uVar13;
            auVar50._8_4_ =
                 (uint)(fVar39 - (float)(-(uint)(fVar39 < fVar37 && 0.0 < fVar37) & 0xbf800000)) &
                 uVar24;
            auVar50._12_4_ =
                 (uint)(fVar46 - (float)(-(uint)(fVar46 < fVar44 && 0.0 < fVar44) & 0xbf800000)) &
                 uVar25;
            auVar33._0_4_ = ~uVar12 & (uint)fVar30;
            auVar33._4_4_ = ~uVar13 & (uint)fVar40;
            auVar33._8_4_ = ~uVar24 & (uint)fVar37;
            auVar33._12_4_ = ~uVar25 & (uint)fVar44;
            *pauVar10 = auVar33 | auVar50;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = local_98;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = ceilf(*(float *)(*pauVar10 + lVar11 * 4));
            *(float *)(*pauVar10 + lVar11 * 4) = fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 4:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar30 = *(float *)((long)*pauVar10 + 4);
            fVar40 = *(float *)((long)*pauVar10 + 8);
            fVar37 = *(float *)((long)*pauVar10 + 0xc);
            auVar17._0_4_ = *(float *)*pauVar10 * *(float *)*pauVar10;
            auVar17._4_4_ = fVar30 * fVar30;
            auVar17._8_4_ = fVar40 * fVar40;
            auVar17._12_4_ = fVar37 * fVar37;
            *pauVar10 = auVar17;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = uVar6 & 0xfffffffc;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = *(float *)((long)*pauVar10 + lVar11 * 4);
            *(float *)((long)*pauVar10 + lVar11 * 4) = fVar30 * fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 5:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar23 = *pauVar10;
            auVar15 = rsqrtps(in_XMM5,auVar23);
            fVar30 = auVar23._0_4_ * auVar15._0_4_;
            fVar40 = auVar23._4_4_ * auVar15._4_4_;
            fVar37 = auVar23._8_4_ * auVar15._8_4_;
            fVar44 = auVar23._12_4_ * auVar15._12_4_;
            in_XMM5._0_4_ =
                 -(uint)(1.1754944e-38 <= ABS(auVar23._0_4_)) &
                 (uint)((fVar30 * auVar15._0_4_ + -3.0) * fVar30 * -0.5);
            in_XMM5._4_4_ =
                 -(uint)(1.1754944e-38 <= ABS(auVar23._4_4_)) &
                 (uint)((fVar40 * auVar15._4_4_ + -3.0) * fVar40 * -0.5);
            in_XMM5._8_4_ =
                 -(uint)(1.1754944e-38 <= ABS(auVar23._8_4_)) &
                 (uint)((fVar37 * auVar15._8_4_ + -3.0) * fVar37 * -0.5);
            in_XMM5._12_4_ =
                 -(uint)(1.1754944e-38 <= ABS(auVar23._12_4_)) &
                 (uint)((fVar44 * auVar15._12_4_ + -3.0) * fVar44 * -0.5);
            *pauVar10 = in_XMM5;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = uVar6 & 0xfffffffc;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            *(float *)(*pauVar10 + lVar11 * 4) = SQRT(*(float *)(*pauVar10 + lVar11 * 4));
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 6:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            in_XMM2 = rsqrtps(in_XMM2,*pauVar10);
            *pauVar10 = in_XMM2;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = uVar6 & 0xfffffffc;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            auVar23 = rsqrtss(ZEXT816(0),ZEXT416((uint)*(float *)(*pauVar10 + lVar11 * 4)));
            fVar40 = auVar23._0_4_;
            fVar30 = *(float *)(*pauVar10 + lVar11 * 4) * fVar40 * fVar40 + -3.0;
            in_XMM2 = ZEXT416((uint)fVar30);
            *(float *)(*pauVar10 + lVar11 * 4) = fVar40 * -0.5 * fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 7:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_98 = uVar6 & 0xfffffffc;
      lVar8 = 0;
      do {
        auVar23 = _DAT_0054de70;
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar2._8_4_ = 0x42b0c0a5;
            auVar2._0_8_ = 0x42b0c0a542b0c0a5;
            auVar2._12_4_ = 0x42b0c0a5;
            auVar15 = minps(*pauVar10,auVar2);
            auVar15 = maxps(auVar15,auVar23);
            fVar40 = auVar15._0_4_ * 1.442695 + 0.5;
            fVar44 = auVar15._4_4_ * 1.442695 + 0.5;
            fVar45 = auVar15._8_4_ * 1.442695 + 0.5;
            fVar46 = auVar15._12_4_ * 1.442695 + 0.5;
            fVar30 = (float)(int)fVar40;
            fVar37 = (float)(int)fVar44;
            fVar38 = (float)(int)fVar45;
            fVar39 = (float)(int)fVar46;
            fVar30 = fVar30 - (float)(-(uint)(fVar40 < fVar30) & 0x3f800000);
            fVar37 = fVar37 - (float)(-(uint)(fVar44 < fVar37) & 0x3f800000);
            fVar38 = fVar38 - (float)(-(uint)(fVar45 < fVar38) & 0x3f800000);
            fVar39 = fVar39 - (float)(-(uint)(fVar46 < fVar39) & 0x3f800000);
            fVar40 = fVar30 * -0.6931472 + auVar15._0_4_;
            fVar44 = fVar37 * -0.6931472 + auVar15._4_4_;
            fVar45 = fVar38 * -0.6931472 + auVar15._8_4_;
            fVar46 = fVar39 * -0.6931472 + auVar15._12_4_;
            auVar42._0_4_ =
                 (float)((int)fVar30 * 0x800000 + 0x3f800000) *
                 (fVar40 + 1.0 +
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5) * fVar40 * fVar40);
            auVar42._4_4_ =
                 (float)((int)fVar37 * 0x800000 + 0x3f800000) *
                 (fVar44 + 1.0 +
                 (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                   0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5) * fVar44 * fVar44);
            auVar42._8_4_ =
                 (float)((int)fVar38 * 0x800000 + 0x3f800000) *
                 (fVar45 + 1.0 +
                 (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                   0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45);
            auVar42._12_4_ =
                 (float)((int)fVar39 * 0x800000 + 0x3f800000) *
                 (fVar46 + 1.0 +
                 (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                   0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46);
            *pauVar10 = auVar42;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = local_98;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = expf(*(float *)(*pauVar10 + lVar11 * 4));
            *(float *)(*pauVar10 + lVar11 * 4) = fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 8:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_98 = uVar6 & 0xfffffffc;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar1._8_4_ = 0x800000;
            auVar1._0_8_ = 0x80000000800000;
            auVar1._12_4_ = 0x800000;
            auVar23 = maxps(*pauVar10,auVar1);
            fVar30 = (float)(auVar23._0_4_ & 0x807fffff | 0x3f000000);
            fVar37 = (float)(auVar23._4_4_ & 0x807fffff | 0x3f000000);
            fVar38 = (float)(auVar23._8_4_ & 0x807fffff | 0x3f000000);
            fVar39 = (float)(auVar23._12_4_ & 0x807fffff | 0x3f000000);
            fVar40 = fVar30 + -1.0 + (float)(-(uint)(fVar30 < 0.70710677) & (uint)fVar30);
            fVar44 = fVar37 + -1.0 + (float)(-(uint)(fVar37 < 0.70710677) & (uint)fVar37);
            fVar45 = fVar38 + -1.0 + (float)(-(uint)(fVar38 < 0.70710677) & (uint)fVar38);
            fVar46 = fVar39 + -1.0 + (float)(-(uint)(fVar39 < 0.70710677) & (uint)fVar39);
            auVar36._0_4_ =
                 ((float)(int)((auVar23._0_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar30 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar40 +
                 (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                       -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 +
                    0.20000714) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5) *
                 fVar40 * fVar40;
            auVar36._4_4_ =
                 ((float)(int)((auVar23._4_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar37 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar44 +
                 (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                       -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 +
                    0.20000714) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5) *
                 fVar44 * fVar44;
            auVar36._8_4_ =
                 ((float)(int)((auVar23._8_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar38 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar45 +
                 (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) * fVar45 +
                       -0.12420141) * fVar45 + 0.14249323) * fVar45 + -0.16668057) * fVar45 +
                    0.20000714) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 + -0.5) *
                 fVar45 * fVar45;
            auVar36._12_4_ =
                 ((float)(int)((auVar23._12_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar39 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar46 +
                 (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46 +
                       -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46 +
                    0.20000714) * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 + -0.5) *
                 fVar46 * fVar46;
            *pauVar10 = auVar36;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = local_98;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = logf(*(float *)(*pauVar10 + lVar11 * 4));
            *(float *)(*pauVar10 + lVar11 * 4) = fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 9:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_98 = uVar6 & 0xfffffffc;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar30 = *(float *)((long)*pauVar10 + 4);
            fVar40 = *(float *)((long)*pauVar10 + 8);
            fVar37 = *(float *)((long)*pauVar10 + 0xc);
            fVar44 = ABS(*(float *)*pauVar10);
            fVar38 = ABS(fVar30);
            fVar45 = ABS(fVar40);
            fVar39 = ABS(fVar37);
            uVar12 = (int)(fVar44 * 1.2732395) + 1;
            uVar24 = (int)(fVar38 * 1.2732395) + 1;
            uVar26 = (int)(fVar45 * 1.2732395) + 1;
            uVar28 = (int)(fVar39 * 1.2732395) + 1;
            fVar44 = (float)(int)(uVar12 & 0xfffffffe) * -0.7853982 + fVar44;
            fVar38 = (float)(int)(uVar24 & 0xfffffffe) * -0.7853982 + fVar38;
            fVar45 = (float)(int)(uVar26 & 0xfffffffe) * -0.7853982 + fVar45;
            fVar39 = (float)(int)(uVar28 & 0xfffffffe) * -0.7853982 + fVar39;
            fVar46 = fVar44 * fVar44;
            fVar51 = fVar38 * fVar38;
            fVar52 = fVar45 * fVar45;
            fVar53 = fVar39 * fVar39;
            uVar13 = -(uint)((uVar12 & 2) == 0);
            uVar25 = -(uint)((uVar24 & 2) == 0);
            uVar27 = -(uint)((uVar26 & 2) == 0);
            uVar29 = -(uint)((uVar28 & 2) == 0);
            auVar48._0_4_ =
                 (uint)(fVar46 * fVar44 *
                        ((fVar46 * -0.00019515296 + 0.008332161) * fVar46 + -0.16666655) + fVar44) &
                 uVar13;
            auVar48._4_4_ =
                 (uint)(fVar51 * fVar38 *
                        ((fVar51 * -0.00019515296 + 0.008332161) * fVar51 + -0.16666655) + fVar38) &
                 uVar25;
            auVar48._8_4_ =
                 (uint)(fVar52 * fVar45 *
                        ((fVar52 * -0.00019515296 + 0.008332161) * fVar52 + -0.16666655) + fVar45) &
                 uVar27;
            auVar48._12_4_ =
                 (uint)(fVar53 * fVar39 *
                        ((fVar53 * -0.00019515296 + 0.008332161) * fVar53 + -0.16666655) + fVar39) &
                 uVar29;
            auVar19._0_4_ =
                 ~uVar13 & (uint)((((fVar46 * 2.4433157e-05 + -0.0013887316) * fVar46 + 0.041666646)
                                   * fVar46 + -0.5) * fVar46 + 1.0);
            auVar19._4_4_ =
                 ~uVar25 & (uint)((((fVar51 * 2.4433157e-05 + -0.0013887316) * fVar51 + 0.041666646)
                                   * fVar51 + -0.5) * fVar51 + 1.0);
            auVar19._8_4_ =
                 ~uVar27 & (uint)((((fVar52 * 2.4433157e-05 + -0.0013887316) * fVar52 + 0.041666646)
                                   * fVar52 + -0.5) * fVar52 + 1.0);
            auVar19._12_4_ =
                 ~uVar29 & (uint)((((fVar53 * 2.4433157e-05 + -0.0013887316) * fVar53 + 0.041666646)
                                   * fVar53 + -0.5) * fVar53 + 1.0);
            auVar19 = auVar19 | auVar48;
            auVar20._0_4_ =
                 auVar19._0_4_ ^ (uVar12 * 0x20000000 ^ (uint)*(float *)*pauVar10) & 0x80000000;
            auVar20._4_4_ = auVar19._4_4_ ^ (uVar24 * 0x20000000 ^ (uint)fVar30) & 0x80000000;
            auVar20._8_4_ = auVar19._8_4_ ^ (uVar26 * 0x20000000 ^ (uint)fVar40) & 0x80000000;
            auVar20._12_4_ = auVar19._12_4_ ^ (uVar28 * 0x20000000 ^ (uint)fVar37) & 0x80000000;
            *pauVar10 = auVar20;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = local_98;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = sinf(*(float *)((long)*pauVar10 + lVar11 * 4));
            *(float *)((long)*pauVar10 + lVar11 * 4) = fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 10:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_98 = uVar6 & 0xfffffffc;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar40 = ABS(*(float *)((long)*pauVar10 + 4));
            fVar37 = ABS(*(float *)((long)*pauVar10 + 8));
            fVar44 = ABS(*(float *)((long)*pauVar10 + 0xc));
            uVar12 = (int)(ABS(*(float *)*pauVar10) * 1.2732395) + 1U & 0xfffffffe;
            uVar24 = (int)(fVar40 * 1.2732395) + 1U & 0xfffffffe;
            uVar26 = (int)(fVar37 * 1.2732395) + 1U & 0xfffffffe;
            uVar28 = (int)(fVar44 * 1.2732395) + 1U & 0xfffffffe;
            fVar30 = (float)(int)uVar12 * -0.7853982 + ABS(*(float *)*pauVar10);
            fVar40 = (float)(int)uVar24 * -0.7853982 + fVar40;
            fVar37 = (float)(int)uVar26 * -0.7853982 + fVar37;
            fVar44 = (float)(int)uVar28 * -0.7853982 + fVar44;
            fVar38 = fVar30 * fVar30;
            fVar45 = fVar40 * fVar40;
            fVar39 = fVar37 * fVar37;
            fVar46 = fVar44 * fVar44;
            uVar12 = uVar12 - 2;
            uVar24 = uVar24 - 2;
            uVar26 = uVar26 - 2;
            uVar28 = uVar28 - 2;
            uVar13 = -(uint)((uVar12 & 2) == 0);
            uVar25 = -(uint)((uVar24 & 2) == 0);
            uVar27 = -(uint)((uVar26 & 2) == 0);
            uVar29 = -(uint)((uVar28 & 2) == 0);
            auVar43._0_4_ =
                 (uint)(fVar38 * fVar30 *
                        ((fVar38 * -0.00019515296 + 0.008332161) * fVar38 + -0.16666655) + fVar30) &
                 uVar13;
            auVar43._4_4_ =
                 (uint)(fVar45 * fVar40 *
                        ((fVar45 * -0.00019515296 + 0.008332161) * fVar45 + -0.16666655) + fVar40) &
                 uVar25;
            auVar43._8_4_ =
                 (uint)(fVar39 * fVar37 *
                        ((fVar39 * -0.00019515296 + 0.008332161) * fVar39 + -0.16666655) + fVar37) &
                 uVar27;
            auVar43._12_4_ =
                 (uint)(fVar46 * fVar44 *
                        ((fVar46 * -0.00019515296 + 0.008332161) * fVar46 + -0.16666655) + fVar44) &
                 uVar29;
            auVar22._0_4_ =
                 ~uVar13 & (uint)((((fVar38 * 2.4433157e-05 + -0.0013887316) * fVar38 + 0.041666646)
                                   * fVar38 + -0.5) * fVar38 + 1.0);
            auVar22._4_4_ =
                 ~uVar25 & (uint)((((fVar45 * 2.4433157e-05 + -0.0013887316) * fVar45 + 0.041666646)
                                   * fVar45 + -0.5) * fVar45 + 1.0);
            auVar22._8_4_ =
                 ~uVar27 & (uint)((((fVar39 * 2.4433157e-05 + -0.0013887316) * fVar39 + 0.041666646)
                                   * fVar39 + -0.5) * fVar39 + 1.0);
            auVar22._12_4_ =
                 ~uVar29 & (uint)((((fVar46 * 2.4433157e-05 + -0.0013887316) * fVar46 + 0.041666646)
                                   * fVar46 + -0.5) * fVar46 + 1.0);
            auVar35._0_4_ = uVar12 * 0x20000000;
            auVar35._4_4_ = uVar24 * 0x20000000;
            auVar35._8_4_ = uVar26 * 0x20000000;
            auVar35._12_4_ = uVar28 * 0x20000000;
            *pauVar10 = auVar35 & _DAT_0054b240 ^ _DAT_0054b240 ^ (auVar22 | auVar43);
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = local_98;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = cosf(*(float *)((long)*pauVar10 + lVar11 * 4));
            *(float *)((long)*pauVar10 + lVar11 * 4) = fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 0xb:
    local_78 = (long)bottom_top_blob->c;
    if (0 < local_78) {
      iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar8 = 0;
      do {
        pafVar9 = (__m128 *)
                  (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if (iVar7 < 4) {
          iVar3 = 0;
        }
        else {
          iVar4 = 0;
          do {
            local_48 = *pafVar9;
            afVar54 = UnaryOp_x86_functor::unary_op_tan::func_pack4(&local_79,&local_48);
            local_48._0_8_ = afVar54._0_8_;
            local_48[2] = (float)(int)extraout_XMM0_Qb;
            local_48[3] = (float)(int)((ulong)extraout_XMM0_Qb >> 0x20);
            *pafVar9 = local_48;
            pafVar9 = pafVar9 + 1;
            iVar3 = iVar4 + 4;
            iVar5 = iVar4 + 7;
            iVar4 = iVar3;
          } while (iVar5 < iVar7);
        }
        if (iVar7 - iVar3 != 0 && iVar3 <= iVar7) {
          lVar11 = 0;
          do {
            fVar30 = tanf((*pafVar9)[lVar11]);
            (*pafVar9)[lVar11] = fVar30;
            lVar11 = lVar11 + 1;
          } while (iVar7 - iVar3 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != local_78);
    }
    break;
  case 0xc:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar30 = *(float *)((long)*pauVar10 + 4);
            fVar40 = *(float *)((long)*pauVar10 + 8);
            fVar37 = *(float *)((long)*pauVar10 + 0xc);
            fVar44 = asinf(*(float *)*pauVar10);
            local_78 = CONCAT44(extraout_XMM0_Db_00,fVar44);
            local_58 = asinf(fVar30);
            local_68 = asinf(fVar40);
            fVar30 = asinf(fVar37);
            auVar18._12_4_ = fVar30;
            auVar18._8_4_ = local_68;
            auVar18._4_4_ = local_58;
            auVar18._0_4_ = (undefined4)local_78;
            *pauVar10 = auVar18;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = uVar6 & 0xfffffffc;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = asinf(*(float *)((long)*pauVar10 + lVar11 * 4));
            *(float *)((long)*pauVar10 + lVar11 * 4) = fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 0xd:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar30 = *(float *)((long)*pauVar10 + 4);
            fVar40 = *(float *)((long)*pauVar10 + 8);
            fVar37 = *(float *)((long)*pauVar10 + 0xc);
            fVar44 = acosf(*(float *)*pauVar10);
            local_78 = CONCAT44(extraout_XMM0_Db_01,fVar44);
            local_58 = acosf(fVar30);
            local_68 = acosf(fVar40);
            fVar30 = acosf(fVar37);
            auVar21._12_4_ = fVar30;
            auVar21._8_4_ = local_68;
            auVar21._4_4_ = local_58;
            auVar21._0_4_ = (undefined4)local_78;
            *pauVar10 = auVar21;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = uVar6 & 0xfffffffc;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = acosf(*(float *)((long)*pauVar10 + lVar11 * 4));
            *(float *)((long)*pauVar10 + lVar11 * 4) = fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 0xe:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar30 = *(float *)((long)*pauVar10 + 4);
            fVar40 = *(float *)((long)*pauVar10 + 8);
            fVar37 = *(float *)((long)*pauVar10 + 0xc);
            fVar44 = atanf(*(float *)*pauVar10);
            local_78 = CONCAT44(extraout_XMM0_Db,fVar44);
            local_58 = atanf(fVar30);
            local_68 = atanf(fVar40);
            fVar30 = atanf(fVar37);
            auVar23._12_4_ = fVar30;
            auVar23._8_4_ = local_68;
            auVar23._4_4_ = local_58;
            auVar23._0_4_ = (undefined4)local_78;
            *pauVar10 = auVar23;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = uVar6 & 0xfffffffc;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = atanf(*(float *)((long)*pauVar10 + lVar11 * 4));
            *(float *)((long)*pauVar10 + lVar11 * 4) = fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 0xf:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar8 = 0;
      do {
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar23 = *pauVar10;
            in_XMM3 = rcpps(in_XMM3,auVar23);
            fVar30 = in_XMM3._0_4_;
            fVar40 = in_XMM3._4_4_;
            fVar37 = in_XMM3._8_4_;
            fVar44 = in_XMM3._12_4_;
            *(float *)*pauVar10 = (1.0 - auVar23._0_4_ * fVar30) * fVar30 + fVar30;
            *(float *)(*pauVar10 + 4) = (1.0 - auVar23._4_4_ * fVar40) * fVar40 + fVar40;
            *(float *)(*pauVar10 + 8) = (1.0 - auVar23._8_4_ * fVar37) * fVar37 + fVar37;
            *(float *)(*pauVar10 + 0xc) = (1.0 - auVar23._12_4_ * fVar44) * fVar44 + fVar44;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = uVar6 & 0xfffffffc;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            *(float *)(*pauVar10 + lVar11 * 4) = 1.0 / *(float *)(*pauVar10 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
    break;
  case 0x10:
    iVar7 = bottom_top_blob->c;
    if (0 < (long)iVar7) {
      uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      local_98 = uVar6 & 0xfffffffc;
      lVar8 = 0;
      do {
        auVar23 = _DAT_0054de60;
        pauVar10 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar6 < 4) {
          uVar12 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar14._0_4_ = *(float *)*pauVar10 * -2.0;
            auVar14._4_4_ = *(float *)((long)*pauVar10 + 4) * -2.0;
            auVar14._8_4_ = *(float *)((long)*pauVar10 + 8) * -2.0;
            auVar14._12_4_ = *(float *)((long)*pauVar10 + 0xc) * -2.0;
            auVar14 = minps(auVar14,auVar23);
            auVar15._8_4_ = 0xc2b0c0a5;
            auVar15._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar15._12_4_ = 0xc2b0c0a5;
            auVar15 = maxps(auVar14,auVar15);
            fVar40 = auVar15._0_4_ * 1.442695 + 0.5;
            fVar44 = auVar15._4_4_ * 1.442695 + 0.5;
            fVar45 = auVar15._8_4_ * 1.442695 + 0.5;
            fVar46 = auVar15._12_4_ * 1.442695 + 0.5;
            fVar30 = (float)(int)fVar40;
            fVar37 = (float)(int)fVar44;
            fVar38 = (float)(int)fVar45;
            fVar39 = (float)(int)fVar46;
            fVar30 = fVar30 - (float)(-(uint)(fVar40 < fVar30) & 0x3f800000);
            fVar37 = fVar37 - (float)(-(uint)(fVar44 < fVar37) & 0x3f800000);
            fVar38 = fVar38 - (float)(-(uint)(fVar45 < fVar38) & 0x3f800000);
            fVar39 = fVar39 - (float)(-(uint)(fVar46 < fVar39) & 0x3f800000);
            fVar40 = fVar30 * -0.6931472 + auVar15._0_4_;
            fVar44 = fVar37 * -0.6931472 + auVar15._4_4_;
            fVar45 = fVar38 * -0.6931472 + auVar15._8_4_;
            fVar46 = fVar39 * -0.6931472 + auVar15._12_4_;
            auVar16._0_4_ = fVar40 * fVar40;
            auVar16._4_4_ = fVar44 * fVar44;
            auVar16._8_4_ = fVar45 * fVar45;
            auVar16._12_4_ = fVar46 * fVar46;
            auVar41._0_4_ =
                 (float)((int)fVar30 * 0x800000 + 0x3f800000) *
                 (fVar40 + 1.0 +
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5) * auVar16._0_4_) + 1.0;
            auVar41._4_4_ =
                 (float)((int)fVar37 * 0x800000 + 0x3f800000) *
                 (fVar44 + 1.0 +
                 (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                   0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5) * auVar16._4_4_) + 1.0;
            auVar41._8_4_ =
                 (float)((int)fVar38 * 0x800000 + 0x3f800000) *
                 (fVar45 + 1.0 +
                 (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                   0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * auVar16._8_4_) + 1.0;
            auVar41._12_4_ =
                 (float)((int)fVar39 * 0x800000 + 0x3f800000) *
                 (fVar46 + 1.0 +
                 (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                   0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * auVar16._12_4_) + 1.0;
            auVar15 = rcpps(auVar16,auVar41);
            fVar30 = auVar15._0_4_;
            fVar40 = auVar15._4_4_;
            fVar37 = auVar15._8_4_;
            fVar44 = auVar15._12_4_;
            auVar47._0_4_ =
                 (2.0 - auVar41._0_4_ * (fVar30 + fVar30)) * fVar30 + fVar30 + fVar30 + -1.0;
            auVar47._4_4_ =
                 (2.0 - auVar41._4_4_ * (fVar40 + fVar40)) * fVar40 + fVar40 + fVar40 + -1.0;
            auVar47._8_4_ =
                 (2.0 - auVar41._8_4_ * (fVar37 + fVar37)) * fVar37 + fVar37 + fVar37 + -1.0;
            auVar47._12_4_ =
                 (2.0 - auVar41._12_4_ * (fVar44 + fVar44)) * fVar44 + fVar44 + fVar44 + -1.0;
            *pauVar10 = auVar47;
            pauVar10 = pauVar10 + 1;
            iVar3 = iVar3 + 4;
            uVar12 = local_98;
          } while (iVar3 < (int)uVar6);
        }
        if (uVar6 - uVar12 != 0 && (int)uVar12 <= (int)uVar6) {
          lVar11 = 0;
          do {
            fVar30 = tanhf(*(float *)((long)*pauVar10 + lVar11 * 4));
            *(float *)((long)*pauVar10 + lVar11 * 4) = fVar30;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar12 != (int)lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar7);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    return 0;
}